

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O0

exr_result_t
exr_attr_set_float_vector(exr_context_t ctxt,int part_index,char *name,int32_t sz,float *val)

{
  exr_context_t ctxt_00;
  uint in_ECX;
  undefined8 in_RDX;
  uint in_ESI;
  _internal_exr_context *in_RDI;
  exr_attribute_list_t *in_R8;
  _internal_exr_part *part;
  _internal_exr_context *pctxt;
  size_t bytes;
  exr_result_t rv;
  exr_attribute_t *attr;
  int32_t in_stack_ffffffffffffffa4;
  _internal_exr_part *arr;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar1;
  char *name_00;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  _internal_exr_context *list;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  exr_result_t eVar2;
  
  name_00 = (char *)0x0;
  uVar1 = 0;
  ctxt_00 = (exr_context_t)((long)(int)in_ECX << 2);
  if (in_RDI == (_internal_exr_context *)0x0) {
    eVar2 = 2;
  }
  else {
    list = in_RDI;
    internal_exr_lock(in_RDI);
    if (((int)in_ESI < 0) || (in_RDI->num_parts <= (int)in_ESI)) {
      internal_exr_unlock(in_RDI);
      eVar2 = (*in_RDI->print_error)(in_RDI,4,"Part index (%d) out of range",(ulong)in_ESI);
    }
    else {
      arr = in_RDI->parts[(int)in_ESI];
      if (in_RDI->mode == '\0') {
        internal_exr_unlock(in_RDI);
        eVar2 = (*in_RDI->standard_error)(in_RDI,8);
      }
      else if (in_RDI->mode == '\x03') {
        internal_exr_unlock(in_RDI);
        eVar2 = (*in_RDI->standard_error)(in_RDI,0x15);
      }
      else if (((int)in_ECX < 0) || ((exr_context_t)0x7fffffff < ctxt_00)) {
        internal_exr_unlock(in_RDI);
        eVar2 = (*in_RDI->print_error)
                          (in_RDI,3,"Invalid size (%d) for float vector \'%s\'",(ulong)in_ECX,in_RDX
                          );
      }
      else if (in_R8 == (exr_attribute_list_t *)0x0) {
        internal_exr_unlock(in_RDI);
        eVar2 = (*in_RDI->print_error)
                          (in_RDI,3,"No input values for setting \'%s\', type \'floatvector\'",
                           in_RDX);
      }
      else {
        eVar2 = exr_attr_list_find_by_name
                          ((exr_const_context_t)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),in_R8,
                           name_00,(exr_attribute_t **)CONCAT44(uVar1,in_stack_ffffffffffffffc0));
        if (eVar2 == 0xf) {
          if (in_RDI->mode != '\x01') {
            internal_exr_unlock(in_RDI);
            return eVar2;
          }
          eVar2 = exr_attr_list_add((exr_context_t)
                                    CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                    (exr_attribute_list_t *)list,
                                    (char *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                                    (exr_attribute_type_t)((ulong)in_RDX >> 0x20),(int32_t)in_RDX,
                                    (uint8_t **)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                                    (exr_attribute_t **)part);
          if (eVar2 == 0) {
            eVar2 = exr_attr_float_vector_create
                              (ctxt_00,(exr_attr_float_vector_t *)in_RDI,(float *)arr,
                               in_stack_ffffffffffffffa4);
          }
        }
        else if (eVar2 == 0) {
          if (*(int *)(name_00 + 0x14) != 9) {
            internal_exr_unlock(in_RDI);
            eVar2 = (*in_RDI->print_error)
                              (in_RDI,0x10,
                               "\'%s\' requested type \'floatvector\', but attribute is type \'%s\'"
                               ,in_RDX,*(undefined8 *)(name_00 + 8));
            return eVar2;
          }
          if ((**(uint **)(name_00 + 0x18) == in_ECX) &&
             (0 < *(int *)(*(long *)(name_00 + 0x18) + 4))) {
            memcpy(*(void **)(*(long *)(name_00 + 0x18) + 8),in_R8,(size_t)ctxt_00);
          }
          else {
            if (in_RDI->mode != '\x01') {
              internal_exr_unlock(in_RDI);
              eVar2 = (*in_RDI->print_error)
                                (in_RDI,0x14,
                                 "Existing float vector \'%s\' has %d, requested %d, unable to change"
                                 ,in_RDX,(ulong)**(uint **)(name_00 + 0x18),(ulong)in_ECX);
              return eVar2;
            }
            exr_attr_float_vector_destroy(ctxt_00,(exr_attr_float_vector_t *)in_RDI);
            eVar2 = exr_attr_float_vector_create
                              (ctxt_00,(exr_attr_float_vector_t *)in_RDI,(float *)arr,
                               in_stack_ffffffffffffffa4);
          }
        }
        internal_exr_unlock(in_RDI);
      }
    }
  }
  return eVar2;
}

Assistant:

exr_result_t
exr_attr_set_float_vector (
    exr_context_t ctxt,
    int           part_index,
    const char*   name,
    int32_t       sz,
    const float*  val)
{
    exr_attribute_t* attr  = NULL;
    exr_result_t     rv    = EXR_ERR_SUCCESS;
    size_t           bytes = (size_t) sz * sizeof (float);

    EXR_PROMOTE_LOCKED_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);

    if (pctxt->mode == EXR_CONTEXT_READ)
        return EXR_UNLOCK_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_NOT_OPEN_WRITE));
    if (pctxt->mode == EXR_CONTEXT_WRITING_DATA)
        return EXR_UNLOCK_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_ALREADY_WROTE_ATTRS));

    if (sz < 0 || bytes > (size_t) INT32_MAX)
        return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid size (%d) for float vector '%s'",
            sz,
            name));

    if (!val)
        return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "No input values for setting '%s', type 'floatvector'",
            name));

    rv = exr_attr_list_find_by_name (
        ctxt, (exr_attribute_list_t*) &(part->attributes), name, &attr);

    if (rv == EXR_ERR_NO_ATTR_BY_NAME)
    {
        if (pctxt->mode != EXR_CONTEXT_WRITE)
            return EXR_UNLOCK_AND_RETURN_PCTXT (rv);

        rv = exr_attr_list_add (
            ctxt,
            &(part->attributes),
            name,
            EXR_ATTR_FLOAT_VECTOR,
            0,
            NULL,
            &(attr));
        if (rv == EXR_ERR_SUCCESS)
            rv =
                exr_attr_float_vector_create (ctxt, attr->floatvector, val, sz);
    }
    else if (rv == EXR_ERR_SUCCESS)
    {
        if (attr->type != EXR_ATTR_FLOAT_VECTOR)
            return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
                pctxt,
                EXR_ERR_ATTR_TYPE_MISMATCH,
                "'%s' requested type 'floatvector', but attribute is type '%s'",
                name,
                attr->type_name));
        if (attr->floatvector->length == sz &&
            attr->floatvector->alloc_size > 0)
        {
            memcpy (EXR_CONST_CAST (void*, attr->floatvector->arr), val, bytes);
        }
        else if (pctxt->mode != EXR_CONTEXT_WRITE)
        {
            return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
                pctxt,
                EXR_ERR_MODIFY_SIZE_CHANGE,
                "Existing float vector '%s' has %d, requested %d, unable to change",
                name,
                attr->floatvector->length,
                sz));
        }
        else
        {
            exr_attr_float_vector_destroy (ctxt, attr->floatvector);
            rv =
                exr_attr_float_vector_create (ctxt, attr->floatvector, val, sz);
        }
    }
    return EXR_UNLOCK_AND_RETURN_PCTXT (rv);
}